

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void init_cache(cache *Cache,int record_length,int max_size,double filling_factor,realse_data realse
               ,add_data add,add_multi_data add_multi,check_data check,get_data_label get_label)

{
  int size;
  record *prVar1;
  uint *puVar2;
  ulong uVar3;
  size_t __nmemb;
  
  Cache->first = -1;
  Cache->last = -1;
  __nmemb = 1000;
  if (0 < record_length) {
    __nmemb = (size_t)(uint)record_length;
  }
  Cache->max_length = __nmemb;
  size = (int)__nmemb;
  prVar1 = (record *)calloc((ulong)(size + 1),0x18);
  Cache->records = prVar1;
  puVar2 = (uint *)calloc(__nmemb,4);
  Cache->stack = puVar2;
  uVar3 = 0x19000;
  if (0 < max_size) {
    uVar3 = (ulong)(uint)max_size;
  }
  Cache->max_size = uVar3;
  prVar1->next = -1;
  prVar1->last = -1;
  prVar1->valid = true;
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/cache.c",
          0x5e,"record_length:%d",__nmemb);
  puVar2 = Cache->stack;
  while (__nmemb != 0) {
    *puVar2 = (uint)__nmemb;
    puVar2 = puVar2 + 1;
    __nmemb = __nmemb - 1;
  }
  Cache->stack_top = size + -1;
  Cache->used_size = 0;
  Cache->length = 0;
  init_hashtable(&Cache->label_hash,size,
                 (double)(-(ulong)(filling_factor <= 0.0) & 0x3fe6666666666666 |
                         ~-(ulong)(filling_factor <= 0.0) &
                         (~-(ulong)(1.0 < filling_factor) & (ulong)filling_factor |
                         -(ulong)(1.0 < filling_factor) & 0x3fe6666666666666)),_hash_label,
                 compare_record_with_label);
  Cache->add = add;
  Cache->realse = realse;
  Cache->add_multi = add_multi;
  Cache->check = check;
  Cache->get_label = get_label;
  Cache->is_init = true;
  pthread_mutex_init((pthread_mutex_t *)&Cache->lock,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

void init_cache(cache*Cache,int record_length,int max_size,double filling_factor,
               realse_data realse,add_data add,add_multi_data add_multi,
               check_data check,get_data_label get_label){
  //初始化函数
  Cache->first = Cache->last = -1;
  
  if(record_length<=0)record_length = LRU_BUFFER_LENGTH; 
  Cache->max_length = record_length;

  Cache->records = (struct record*)calloc(record_length+1,sizeof(struct record));
  Cache->stack = (unsigned*)calloc(record_length,sizeof(unsigned));

  if(max_size<=0)max_size = CACHE_SIZE;
  Cache->max_size = max_size;

  Cache->records[LRU_BUFFER_HEAD_POINT].last = -1;
  Cache->records[LRU_BUFFER_HEAD_POINT].next = -1;
  Cache->records[LRU_BUFFER_HEAD_POINT].valid = 1; //头结点
  log_info("record_length:%d",record_length);
  for (int i = 0, j = record_length; i < record_length;
       i++, j--) {
    Cache->stack[i] = j; // 1~MAX 都是可用的 0是头结点
  }
  Cache->stack_top = record_length - 1;
  Cache->used_size = 0;
  Cache->length = 0;
  if(filling_factor<=0||filling_factor>1)filling_factor = CACHE_FILLING_FACTOR;
  init_hashtable(&Cache->label_hash,record_length,filling_factor,_hash_label,compare_record_with_label);
  Cache->add = add;
  Cache->realse =realse;
  Cache->add_multi = add_multi;
  Cache->check = check;
  Cache->get_label =get_label;
  Cache->is_init = true;
  pthread_mutex_init(&Cache->lock,NULL);//初始化锁
}